

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

void xmlNodeAddContent(xmlNodePtr cur,xmlChar *content)

{
  int len;
  
  if (content == (xmlChar *)0x0 || cur == (xmlNodePtr)0x0) {
    return;
  }
  len = xmlStrlen(content);
  xmlNodeAddContentLen(cur,content,len);
  return;
}

Assistant:

void
xmlNodeAddContent(xmlNodePtr cur, const xmlChar *content) {
    int len;

    if (cur == NULL) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlNodeAddContent : node == NULL\n");
#endif
	return;
    }
    if (content == NULL) return;
    len = xmlStrlen(content);
    xmlNodeAddContentLen(cur, content, len);
}